

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O2

void __thiscall Logger::addLogQueue(Logger *this,LogLevel level,string *message)

{
  unique_lock<std::mutex> lock;
  string datetime;
  unique_lock<std::mutex> uStack_98;
  string local_88;
  undefined1 local_68 [40];
  string local_40 [32];
  
  getDateTime_abi_cxx11_(&local_88,this);
  std::unique_lock<std::mutex>::unique_lock(&uStack_98,&this->logQueueMtx);
  local_68._0_4_ = level;
  std::__cxx11::string::string((string *)(local_68 + 8),(string *)&local_88);
  std::__cxx11::string::string(local_40,(string *)message);
  std::deque<LogMessage,_std::allocator<LogMessage>_>::emplace_back<LogMessage>
            (&(this->logQueue).c,(LogMessage *)local_68);
  LogMessage::~LogMessage((LogMessage *)local_68);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(&uStack_98);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

inline void addLogQueue(LogLevel level, const std::string& message) // 添加到日志队列中
    {
        std::string datetime = getDateTime();
        std::unique_lock<std::mutex> lock(logQueueMtx);
        logQueue.push({level, datetime, message});
        cv.notify_one(); // 唤醒等待的线程
    }